

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

void __thiscall
stream::slice_reader::slice_reader
          (slice_reader *this,path_type *dirname,string *basename,string *basename2,
          size_t disk_slice_count)

{
  string *in_RCX;
  string *in_RDX;
  undefined4 *in_RDI;
  undefined8 in_R8;
  path *in_stack_ffffffffffffffa8;
  string *this_00;
  
  *in_RDI = 0;
  std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
            ((path *)(in_RDI + 2),in_stack_ffffffffffffffa8);
  this_00 = (string *)(in_RDI + 10);
  std::__cxx11::string::string(this_00,in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x12),in_RCX);
  *(undefined8 *)(in_RDI + 0x1a) = in_R8;
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  in_RDI[0x1e] = 0;
  boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)this_00);
  *(undefined4 **)(in_RDI + 0xa2) = in_RDI + 0x20;
  return;
}

Assistant:

slice_reader::slice_reader(const path_type & dirname, const std::string & basename,
                           const std::string & basename2, size_t disk_slice_count)
	: data_offset(0),
	  dir(dirname), base_file(basename), base_file2(basename2),
	  slices_per_disk(disk_slice_count), current_slice(0), slice_size(0),
	  is(&ifs) { }